

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O0

operation diy::mpi::detail::get_builtin_operation(BuiltinOperation id)

{
  MPI_Op *obj;
  uint in_EDI;
  operation op;
  DIY_MPI_Op local_8;
  
  local_8.data = (MPI_Op)0x0;
  obj = (MPI_Op *)(ulong)in_EDI;
  switch(obj) {
  case (MPI_Op *)0x0:
    local_8 = make_DIY_MPI_Op(obj);
    break;
  case (MPI_Op *)0x1:
    local_8 = make_DIY_MPI_Op(obj);
    break;
  case (MPI_Op *)0x2:
    local_8 = make_DIY_MPI_Op(obj);
    break;
  case (MPI_Op *)0x3:
    local_8 = make_DIY_MPI_Op(obj);
    break;
  case (MPI_Op *)0x4:
    local_8 = make_DIY_MPI_Op(obj);
    break;
  case (MPI_Op *)0x5:
    local_8 = make_DIY_MPI_Op(obj);
  }
  return (operation)(DIY_MPI_Op)local_8.data;
}

Assistant:

operation get_builtin_operation(BuiltinOperation id)
{
  operation op{};
  switch(id)
  {
    case OP_MAXIMUM:     op.handle = make_DIY_MPI_Op(MPI_MAX);  break;
    case OP_MINIMUM:     op.handle = make_DIY_MPI_Op(MPI_MIN);  break;
    case OP_PLUS:        op.handle = make_DIY_MPI_Op(MPI_SUM);  break;
    case OP_MULTIPLIES:  op.handle = make_DIY_MPI_Op(MPI_PROD); break;
    case OP_LOGICAL_AND: op.handle = make_DIY_MPI_Op(MPI_LAND); break;
    case OP_LOGICAL_OR:  op.handle = make_DIY_MPI_Op(MPI_LOR);  break;
    default: break;
  }
  return op;
}